

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

mat44 * nifti_quatern_to_mat44
                  (mat44 *__return_storage_ptr__,float qb,float qc,float qd,float qx,float qy,
                  float qz,float dx,float dy,float dz,float qfac)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  longdouble lVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double local_b0;
  
  dVar3 = (double)qb;
  dVar4 = (double)qc;
  dVar2 = (double)qd;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 0xc) = 1.0;
  local_b0 = dVar4 * dVar4;
  dVar6 = dVar2 * dVar2 + dVar3 * dVar3 + local_b0;
  dVar1 = 1.0 - dVar6;
  if (_DAT_00125130 <= (longdouble)dVar1) {
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
  }
  else {
    dVar1 = 1.0 / SQRT(dVar6);
    dVar3 = dVar3 * dVar1;
    dVar4 = dVar4 * dVar1;
    dVar2 = dVar2 * dVar1;
    local_b0 = dVar4 * dVar4;
    dVar1 = 0.0;
  }
  dVar6 = 1.0;
  if (0.0 < dz) {
    dVar12 = (double)dz;
  }
  else {
    dVar12 = 1.0;
  }
  uVar8 = (ulong)DAT_00125140;
  if (qfac < 0.0) {
    dVar12 = (double)CONCAT44((uint)((ulong)dVar12 >> 0x20) ^ DAT_00125140._4_4_,
                              SUB84(dVar12,0) ^ (uint)DAT_00125140);
  }
  if (0.0 < dy) {
    dVar10 = (double)dy;
  }
  else {
    dVar10 = 1.0;
  }
  if (0.0 < dx) {
    dVar6 = (double)dx;
  }
  dVar13 = dVar1 * dVar1;
  dVar11 = (double)((ulong)dVar4 ^ uVar8) * dVar4;
  dVar7 = (double)((ulong)dVar2 ^ uVar8) * dVar2;
  __return_storage_ptr__->m[0][0] = (float)((dVar3 * dVar3 + dVar13 + dVar11 + dVar7) * dVar6);
  lVar5 = (longdouble)(dVar3 * dVar4 - dVar2 * dVar1);
  __return_storage_ptr__->m[0][1] = (float)((lVar5 + lVar5) * (longdouble)dVar10);
  lVar5 = (longdouble)(dVar3 * dVar2 + dVar4 * dVar1);
  __return_storage_ptr__->m[0][2] = (float)((lVar5 + lVar5) * (longdouble)dVar12);
  lVar5 = (longdouble)(dVar3 * dVar4 + dVar2 * dVar1);
  dVar9 = (double)(uVar8 ^ (ulong)dVar3) * dVar3;
  __return_storage_ptr__->m[1][0] = (float)((lVar5 + lVar5) * (longdouble)dVar6);
  __return_storage_ptr__->m[1][1] = (float)((local_b0 + dVar13 + dVar9 + dVar7) * dVar10);
  lVar5 = (longdouble)(dVar4 * dVar2 - dVar3 * dVar1);
  __return_storage_ptr__->m[1][2] = (float)((lVar5 + lVar5) * (longdouble)dVar12);
  lVar5 = (longdouble)(dVar3 * dVar2 - dVar4 * dVar1);
  __return_storage_ptr__->m[2][0] = (float)((lVar5 + lVar5) * (longdouble)dVar6);
  lVar5 = (longdouble)(dVar4 * dVar2 + dVar3 * dVar1);
  __return_storage_ptr__->m[2][1] = (float)((lVar5 + lVar5) * (longdouble)dVar10);
  __return_storage_ptr__->m[2][2] = (float)((dVar2 * dVar2 + dVar13 + dVar11 + dVar9) * dVar12);
  __return_storage_ptr__->m[0][3] = qx;
  __return_storage_ptr__->m[1][3] = qy;
  __return_storage_ptr__->m[2][3] = qz;
  return __return_storage_ptr__;
}

Assistant:

mat44 nifti_quatern_to_mat44( float qb, float qc, float qd,
                              float qx, float qy, float qz,
                              float dx, float dy, float dz, float qfac )
{
   mat44 R ;
   double a,b=qb,c=qc,d=qd , xd,yd,zd ;

   /* last row is always [ 0 0 0 1 ] */

   R.m[3][0]=R.m[3][1]=R.m[3][2] = 0.0f ; R.m[3][3]= 1.0f ;

   /* compute a parameter from b,c,d */

   a = 1.0l - (b*b + c*c + d*d) ;
   if( a < 1.e-7l ){                   /* special case */
     a = 1.0l / sqrt(b*b+c*c+d*d) ;
     b *= a ; c *= a ; d *= a ;        /* normalize (b,c,d) vector */
     a = 0.0l ;                        /* a = 0 ==> 180 degree rotation */
   } else{
     a = sqrt(a) ;                     /* angle = 2*arccos(a) */
   }

   /* load rotation matrix, including scaling factors for voxel sizes */

   xd = (dx > 0.0) ? dx : 1.0l ;       /* make sure are positive */
   yd = (dy > 0.0) ? dy : 1.0l ;
   zd = (dz > 0.0) ? dz : 1.0l ;

   if( qfac < 0.0 ) zd = -zd ;         /* left handedness? */

   R.m[0][0] = (float)( (a*a+b*b-c*c-d*d) * xd) ;
   R.m[0][1] = 2.0l * (b*c-a*d        ) * yd ;
   R.m[0][2] = 2.0l * (b*d+a*c        ) * zd ;
   R.m[1][0] = 2.0l * (b*c+a*d        ) * xd ;
   R.m[1][1] = (float)( (a*a+c*c-b*b-d*d) * yd) ;
   R.m[1][2] = 2.0l * (c*d-a*b        ) * zd ;
   R.m[2][0] = 2.0l * (b*d-a*c        ) * xd ;
   R.m[2][1] = 2.0l * (c*d+a*b        ) * yd ;
   R.m[2][2] = (float)( (a*a+d*d-c*c-b*b) * zd) ;

   /* load offsets */

   R.m[0][3] = qx ; R.m[1][3] = qy ; R.m[2][3] = qz ;

   return R ;
}